

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5IndexFlush(Fts5Index *p)

{
  Fts5StructureSegment *pFVar1;
  Fts5HashEntry *pFVar2;
  int *piVar3;
  Fts5Index *p_00;
  u8 *pTerm;
  int iVar4;
  Fts5Structure *pFVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Fts5Structure *pStruct_00;
  size_t sVar10;
  u64 v;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  Fts5Structure *pStruct;
  uchar *puVar14;
  undefined8 in_R8;
  uchar *p_01;
  uint uVar15;
  int iVar16;
  int iVar17;
  Fts5Hash *p_02;
  long lVar18;
  ulong uVar19;
  u32 dummy;
  int pgnoLast;
  int nDoclist;
  u8 *pDoclist;
  Fts5SegWriter writer;
  char *zTerm;
  uint local_13c;
  int *local_138;
  Fts5Index *local_130;
  int local_128;
  int local_124;
  u8 *local_120;
  uchar *local_118;
  ulong local_110;
  int local_104;
  int local_100;
  int local_fc;
  Fts5Hash *local_f8;
  size_t local_f0;
  u64 local_e8;
  u64 local_e0;
  u8 *local_d8;
  Fts5Structure *local_d0;
  Fts5SegWriter local_c8;
  Fts5Structure *local_50;
  ulong local_48;
  long local_40;
  u8 *local_38;
  
  if (p->nPendingData == 0) {
    return;
  }
  p->nPendingData = 0;
  p_02 = p->pHash;
  local_124 = 0;
  pStruct_00 = fts5StructureRead(p);
  local_d0 = pStruct_00;
  iVar7 = fts5AllocateSegid(p,pStruct_00);
  if (p->pStruct != (Fts5Structure *)0x0) {
    fts5StructureRelease(p->pStruct);
    p->pStruct = (Fts5Structure *)0x0;
  }
  local_130 = p;
  if (iVar7 == 0) {
    lVar18 = 0;
  }
  else {
    iVar16 = p->pConfig->eDetail;
    iVar17 = p->pConfig->pgsz;
    fts5WriteInit(p,&local_c8,iVar7);
    iVar9 = (int)in_R8;
    local_138 = &p->rc;
    if (p->rc == 0) {
      iVar8 = sqlite3Fts5HashScanInit(p_02,(char *)0x0,0);
      iVar9 = (int)in_R8;
      *local_138 = iVar8;
      if ((iVar8 == 0) &&
         (iVar8 = iVar16, iVar4 = iVar17, pFVar5 = pStruct_00, p_02->pScan != (Fts5HashEntry *)0x0))
      {
        while( true ) {
          local_50 = pFVar5;
          local_f8 = p_02;
          local_100 = iVar4;
          local_104 = iVar8;
          local_128 = iVar7;
          sqlite3Fts5HashScanEntry(local_f8,(char **)&local_38,&local_d8,&local_fc);
          pTerm = local_38;
          sVar10 = strlen((char *)local_38);
          fts5WriteAppendTerm(p,&local_c8,(int)sVar10,pTerm);
          iVar9 = (int)in_R8;
          p_02 = local_f8;
          iVar7 = local_128;
          if (p->rc != 0) break;
          uVar11 = local_fc + local_c8.writer.buf.n;
          if ((int)(local_c8.writer.pgidx.n + uVar11) < iVar17) {
            memcpy(local_c8.writer.buf.p + local_c8.writer.buf.n,local_d8,(long)local_fc);
            iVar8 = *local_138;
            local_c8.writer.buf.n = uVar11;
          }
          else {
            local_e0 = 0;
            if (0 < local_fc) {
              local_e8 = 0;
              local_120 = local_d8;
              uVar13 = 0;
              local_f0 = (long)local_fc;
              do {
                bVar6 = sqlite3Fts5GetVarint(local_120 + (int)uVar13,&local_e0);
                iVar7 = local_c8.writer.buf.n;
                v = local_e8 + local_e0;
                local_e8 = v;
                if (local_c8.bFirstRowidInPage == '\0') {
                  iVar9 = sqlite3Fts5PutVarint
                                    (local_c8.writer.buf.p + local_c8.writer.buf.n,local_e0);
                  local_c8.writer.buf.n = iVar9 + iVar7;
                }
                else {
                  *local_c8.writer.buf.p = (u8)((uint)local_c8.writer.buf.n >> 8);
                  local_c8.writer.buf.p[1] = (u8)local_c8.writer.buf.n;
                  local_110 = CONCAT71(local_110._1_7_,bVar6);
                  iVar9 = sqlite3Fts5PutVarint(local_c8.writer.buf.p + local_c8.writer.buf.n,v);
                  local_c8.writer.buf.n = iVar9 + iVar7;
                  local_c8.bFirstRowidInPage = '\0';
                  bVar6 = (byte)local_110;
                  fts5WriteDlidxAppend(p,&local_c8,v);
                  iVar8 = p->rc;
                  if (iVar8 != 0) goto LAB_001d2657;
                }
                uVar11 = (int)uVar13 + (uint)bVar6;
                if (iVar16 == 1) {
                  iVar7 = (int)local_f0;
                  if (((int)uVar11 < iVar7) && (local_120[(int)uVar11] == '\0')) {
                    uVar19 = (long)local_c8.writer.buf.n + 1;
                    local_c8.writer.buf.p[local_c8.writer.buf.n] = '\0';
                    uVar13 = (long)(int)uVar11 + 1;
                    uVar15 = (uint)uVar19;
                    if (((int)uVar13 < iVar7) && (local_120[uVar13] == '\0')) {
                      local_c8.writer.buf.n = local_c8.writer.buf.n + 2;
                      local_c8.writer.buf.p[uVar19] = '\0';
                      uVar11 = uVar11 + 2;
                      goto LAB_001d2597;
                    }
                  }
                  else {
LAB_001d2597:
                    uVar19 = (ulong)(uint)local_c8.writer.buf.n;
                    uVar13 = (ulong)uVar11;
                    uVar15 = local_c8.writer.buf.n;
                  }
                  local_c8.writer.buf.n = uVar15;
                  if (iVar17 <= (int)uVar19 + local_c8.writer.pgidx.n) {
                    fts5WriteFlushLeaf(p,&local_c8);
                  }
                  uVar13 = uVar13 & 0xffffffff;
                }
                else {
                  local_118 = local_120 + (int)uVar11;
                  local_13c = (uint)local_120[(int)uVar11];
                  iVar7 = 1;
                  if ((char)local_120[(int)uVar11] < '\0') {
                    iVar7 = sqlite3Fts5GetVarint32(local_118,&local_13c);
                  }
                  uVar15 = (int)local_13c / 2 + iVar7;
                  uVar12 = local_c8.writer.buf.n + uVar15;
                  if (iVar17 < (int)(local_c8.writer.pgidx.n + uVar12)) {
                    iVar7 = 0;
                    puVar14 = local_118;
                    local_48 = (ulong)uVar15;
                    do {
                      uVar15 = (uint)local_48;
                      if (*local_138 != 0) break;
                      local_40 = (long)local_c8.writer.buf.n;
                      local_110 = (ulong)(uint)local_c8.writer.pgidx.n;
                      iVar17 = iVar17 - (local_c8.writer.pgidx.n + local_c8.writer.buf.n);
                      uVar15 = uVar15 - iVar7;
                      if (iVar17 < (int)uVar15) {
                        p_01 = puVar14 + iVar7;
                        uVar15 = sqlite3Fts5GetVarint32(p_01,&local_13c);
                        puVar14 = local_118;
                        if ((int)uVar15 < iVar17) {
                          uVar12 = uVar15;
                          do {
                            uVar15 = uVar12;
                            iVar16 = sqlite3Fts5GetVarint32(p_01 + uVar15,&local_13c);
                            puVar14 = local_118;
                            uVar12 = iVar16 + uVar15;
                          } while ((int)(iVar16 + uVar15) <= iVar17);
                        }
                      }
                      lVar18 = local_40;
                      memcpy(local_c8.writer.buf.p + local_40,puVar14 + iVar7,(long)(int)uVar15);
                      iVar17 = local_100;
                      local_c8.writer.buf.n = uVar15 + (int)lVar18;
                      if (local_100 <= local_c8.writer.buf.n + (int)local_110) {
                        fts5WriteFlushLeaf(local_130,&local_c8);
                      }
                      iVar7 = iVar7 + uVar15;
                      uVar15 = (uint)local_48;
                    } while (iVar7 < (int)uVar15);
                  }
                  else {
                    memcpy(local_c8.writer.buf.p + local_c8.writer.buf.n,local_118,(long)(int)uVar15
                          );
                    local_c8.writer.buf.n = uVar12;
                  }
                  uVar13 = (ulong)(uVar15 + uVar11);
                  iVar7 = (int)local_f0;
                  pStruct_00 = local_50;
                  p = local_130;
                  iVar16 = local_104;
                }
                iVar8 = *local_138;
                if ((iVar8 != 0) || (iVar7 <= (int)uVar13)) goto LAB_001d2657;
              } while( true );
            }
            iVar8 = 0;
          }
LAB_001d2657:
          iVar9 = (int)in_R8;
          p_02 = local_f8;
          iVar7 = local_128;
          if ((iVar8 != 0) ||
             (pFVar2 = local_f8->pScan->pScanNext, local_f8->pScan = pFVar2, iVar8 = local_104,
             iVar4 = local_100, pFVar5 = local_50, pFVar2 == (Fts5HashEntry *)0x0)) break;
        }
      }
    }
    sqlite3Fts5HashClear(p_02);
    fts5WriteFinish(p,&local_c8,&local_124);
    if (pStruct_00->nLevel == 0) {
      fts5StructureAddLevel(local_138,&local_d0);
      pStruct_00 = local_d0;
      p = local_130;
    }
    piVar3 = local_138;
    fts5StructureExtendLevel(local_138,pStruct_00,0,0,iVar9);
    if (*piVar3 == 0) {
      pFVar1 = pStruct_00->aLevel[0].aSeg;
      iVar16 = pStruct_00->aLevel[0].nSeg;
      pStruct_00->aLevel[0].nSeg = iVar16 + 1;
      pFVar1[iVar16].iSegid = iVar7;
      pFVar1[iVar16].pgnoFirst = 1;
      pFVar1[iVar16].pgnoLast = local_124;
      pStruct_00->nSegment = pStruct_00->nSegment + 1;
    }
    lVar18 = (long)local_124;
    fts5StructurePromote(p,0,pStruct_00);
  }
  if (p->rc == 0) {
    iVar7 = p->pConfig->nAutomerge;
    if (iVar7 < 1) {
      iVar7 = p->pConfig->nCrisisMerge;
    }
    else {
      uVar13 = pStruct_00->nWriteCounter;
      uVar19 = lVar18 + uVar13;
      iVar16 = p->nWorkUnit;
      pStruct_00->nWriteCounter = uVar19;
      fts5IndexMerge(p,&local_d0,
                     ((int)(uVar19 / (ulong)(long)iVar16) - (int)(uVar13 / (ulong)(long)iVar16)) *
                     iVar16 * pStruct_00->nLevel,iVar7);
      local_c8._0_8_ = local_d0;
      iVar7 = p->pConfig->nCrisisMerge;
      pStruct_00 = local_d0;
      if (p->rc != 0) goto LAB_001d2164;
    }
    p_00 = local_130;
    iVar16 = 1;
    lVar18 = 0x1c;
    local_c8._0_8_ = pStruct_00;
    do {
      if (*(int *)((long)pStruct_00->aLevel + lVar18 + -0x18) < iVar7) break;
      fts5IndexMergeLevel(p_00,(Fts5Structure **)&local_c8,iVar16 + -1,(int *)0x0);
      pStruct_00 = (Fts5Structure *)local_c8._0_8_;
      fts5StructurePromote(p_00,iVar16,(Fts5Structure *)local_c8._0_8_);
      iVar16 = iVar16 + 1;
      lVar18 = lVar18 + 0x10;
    } while (p_00->rc == 0);
  }
LAB_001d2164:
  fts5StructureWrite(local_130,pStruct_00);
  fts5StructureRelease(pStruct_00);
  return;
}

Assistant:

static void fts5IndexFlush(Fts5Index *p){
  /* Unless it is empty, flush the hash table to disk */
  if( p->nPendingData ){
    assert( p->pHash );
    p->nPendingData = 0;
    fts5FlushOneHash(p);
  }
}